

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O3

void PrintFinalStats(void *kmem)

{
  uint uVar1;
  long leniwB;
  long lenrwB;
  long nfeD;
  long nje;
  long nfe;
  long nni;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  uVar1 = KINGetNumNonlinSolvIters(kmem,&local_10);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumNonlinSolvIters",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumFuncEvals(kmem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumFuncEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumJacEvals(kmem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumJacEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetNumLinFuncEvals(kmem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetNumLinFuncEvals",
            (ulong)uVar1);
  }
  uVar1 = KINGetLinWorkSpace(kmem,&local_30,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","KINGetLinWorkSpace",
            (ulong)uVar1);
  }
  puts("\nFinal Statistics.. \n");
  printf("nni      = %6ld    nfe     = %6ld \n",local_10,local_18);
  printf("nje      = %6ld    nfeB    = %6ld \n",local_20,local_28);
  putchar(10);
  printf("lenrwB   = %6ld    leniwB  = %6ld \n",local_30,local_38);
  return;
}

Assistant:

static void PrintFinalStats(void *kmem)
{
  long int nni, nfe, nje, nfeD;
  long int lenrwB, leniwB;
  int flag;

  /* Main solver statistics */

  flag = KINGetNumNonlinSolvIters(kmem, &nni);
  check_flag(&flag, "KINGetNumNonlinSolvIters", 1);
  flag = KINGetNumFuncEvals(kmem, &nfe);
  check_flag(&flag, "KINGetNumFuncEvals", 1);

  /* Band linear solver statistics */

  flag = KINGetNumJacEvals(kmem, &nje);
  check_flag(&flag, "KINGetNumJacEvals", 1);
  flag = KINGetNumLinFuncEvals(kmem, &nfeD);
  check_flag(&flag, "KINGetNumLinFuncEvals", 1);

  /* Band linear solver workspace size */

  flag = KINGetLinWorkSpace(kmem, &lenrwB, &leniwB);
  check_flag(&flag, "KINGetLinWorkSpace", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n", nni, nfe);
  printf("nje      = %6ld    nfeB    = %6ld \n", nje, nfeD);
  printf("\n");
  printf("lenrwB   = %6ld    leniwB  = %6ld \n", lenrwB, leniwB);

}